

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,REF_CLOUD *one_layer,REF_NODE ref_node)

{
  REF_GLOB RVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_GLOB *pRVar4;
  REF_CLOUD pRVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  REF_INT local_pivot;
  REF_CLOUD copy;
  REF_DBL xyzs [4];
  int local_6c;
  REF_CLOUD local_68;
  REF_NODE local_60;
  REF_DBL local_58 [5];
  
  uVar3 = ref_cloud_deep_copy(&local_68,ref_cloud);
  if (uVar3 == 0) {
    if (0 < local_68->n) {
      pRVar4 = local_68->global;
      lVar9 = 0;
      local_60 = ref_node;
      while( true ) {
        RVar1 = *pRVar4;
        uVar3 = ref_node_local(local_60,RVar1,&local_6c);
        if (uVar3 == 0) {
          pRVar5 = one_layer[local_6c];
          if (0 < pRVar5->n) {
            pRVar4 = pRVar5->global;
            lVar13 = 0;
            lVar14 = 0;
            while( true ) {
              RVar1 = *pRVar4;
              lVar7 = (long)pRVar5->naux;
              if (0 < lVar7) {
                pRVar2 = pRVar5->aux;
                lVar6 = 0;
                do {
                  local_58[lVar6] = *(REF_DBL *)((long)pRVar2 + lVar6 * 8 + lVar13 * lVar7);
                  lVar6 = lVar6 + 1;
                } while (lVar7 != lVar6);
              }
              uVar3 = ref_cloud_store(ref_cloud,RVar1,local_58);
              if (uVar3 != 0) {
                uVar11 = (ulong)uVar3;
                pcVar12 = "store stencil increase";
                uVar8 = 0x3b3;
                goto LAB_001b0af4;
              }
              lVar14 = lVar14 + 1;
              pRVar5 = one_layer[local_6c];
              if (pRVar5->n <= lVar14) break;
              pRVar4 = pRVar5->global + lVar14;
              lVar13 = lVar13 + 8;
            }
          }
        }
        else {
          uVar11 = (ulong)uVar3;
          if (uVar3 != 5) {
            pcVar12 = "local search";
            uVar8 = 0x3ad;
            goto LAB_001b0af4;
          }
          printf("global %ld not found\n",RVar1);
        }
        lVar9 = lVar9 + 1;
        if (local_68->n <= lVar9) break;
        pRVar4 = local_68->global + lVar9;
      }
    }
    ref_cloud_free(local_68);
    RVar10 = 0;
  }
  else {
    uVar11 = (ulong)uVar3;
    pcVar12 = "copy";
    uVar8 = 0x3a6;
LAB_001b0af4:
    RVar10 = (REF_STATUS)uVar11;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar8,
           "ref_recon_grow_cloud_one_layer",uVar11,pcVar12);
  }
  return RVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,
                                                         REF_CLOUD *one_layer,
                                                         REF_NODE ref_node) {
  REF_CLOUD copy;
  REF_STATUS ref_status;
  REF_INT pivot_index, local_pivot;
  REF_INT add_index, i;
  REF_GLOB global, global_pivot;
  REF_DBL xyzs[4];
  RSS(ref_cloud_deep_copy(&copy, ref_cloud), "copy");
  each_ref_cloud_global(copy, pivot_index, global_pivot) {
    ref_status = ref_node_local(ref_node, global_pivot, &local_pivot);
    if (REF_NOT_FOUND == ref_status) {
      printf("global %ld not found\n", global_pivot);
      continue;
    } else {
      RSS(ref_status, "local search");
    }
    each_ref_cloud_global(one_layer[local_pivot], add_index, global) {
      each_ref_cloud_aux(one_layer[local_pivot], i) {
        xyzs[i] = ref_cloud_aux(one_layer[local_pivot], i, add_index);
      }
      RSS(ref_cloud_store(ref_cloud, global, xyzs), "store stencil increase");
    }
  }
  ref_cloud_free(copy);

  return REF_SUCCESS;
}